

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::ArrayBuilder<kj::StringPtr>::~ArrayBuilder(ArrayBuilder<kj::StringPtr> *this)

{
  StringPtr *pSVar1;
  RemoveConst<kj::StringPtr> *pRVar2;
  StringPtr *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringPtr *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (StringPtr *)0x0;
    this->pos = (RemoveConst<kj::StringPtr> *)0x0;
    this->endPtr = (StringPtr *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x10,(long)pRVar2 - (long)pSVar1 >> 4,
               (long)pSVar3 - (long)pSVar1 >> 4,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }